

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1520.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  char *__s;
  size_t len;
  char *data;
  upload_status *upload_ctx;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (((size == 0) || (nmemb == 0)) || (size * nmemb == 0)) {
    ptr_local = (void *)0x0;
  }
  else {
    __s = payload_text[*userp];
    if (__s == (char *)0x0) {
      ptr_local = (void *)0x0;
    }
    else {
      ptr_local = (void *)strlen(__s);
      memcpy(ptr,__s,(size_t)ptr_local);
      *(int *)userp = *userp + 1;
    }
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct upload_status *upload_ctx = (struct upload_status *)userp;
  const char *data;

  if((size == 0) || (nmemb == 0) || ((size*nmemb) < 1)) {
    return 0;
  }

  data = payload_text[upload_ctx->lines_read];

  if(data) {
    size_t len = strlen(data);
    memcpy(ptr, data, len);
    upload_ctx->lines_read++;

    return len;
  }

  return 0;
}